

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVectorTests.cpp
# Opt level: O2

void (anonymous_namespace)::
     assertValuesInOrder<slang::SmallVector<(anonymous_namespace)::Constructable,5ul>,int,int,int>
               (SmallVector<(anonymous_namespace)::Constructable,_5UL> *v,int *args,int *args_1,
               int *args_2)

{
  pointer pCVar1;
  StringRef macroName;
  StringRef capturedExpression;
  ExprLhs<bool> local_7d;
  array<int,_3UL> a;
  AssertionHandler catchAssertionHandler;
  SourceLineInfo local_28;
  
  a._M_elems[0] = *args;
  a._M_elems[1] = *args_1;
  a._M_elems[2] = *args_2;
  local_28.file =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/util/SmallVectorTests.cpp"
  ;
  local_28.line = 0x6b;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x36;
  capturedExpression.m_start = "std::ranges::equal(v, a, {}, &Constructable::getValue)";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,&local_28,capturedExpression,ContinueOnFailure);
  pCVar1 = (v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).data_;
  local_28.file = (char *)anon_unknown.dwarf_965823::Constructable::getValue;
  local_28.line = 0;
  local_7d.m_lhs =
       std::ranges::__equal_fn::
       operator()<(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*,_int_*,_int_*,_std::ranges::equal_to,_int_((anonymous_namespace)::Constructable::*)()_const,_std::identity>
                 ((__equal_fn *)pCVar1,
                  pCVar1 + (v->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len,&a,
                  &catchAssertionHandler);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,&local_7d);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void assertValuesInOrder(TVector& v, TArgs&&... args) {
    auto a = std::array{std::forward<TArgs>(args)...};
    CHECK(std::ranges::equal(v, a, {}, &Constructable::getValue));
}